

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

bool __thiscall CScript::IsPushOnly(CScript *this,const_iterator pc)

{
  long lVar1;
  bool bVar2;
  const_iterator x;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  opcodetype opcode;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *pc_00;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pc_00 = in_RDI;
  while( true ) {
    x = prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_RDI);
    bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator<
                      ((const_iterator *)in_RDI,x);
    if (!bVar2) {
      bVar2 = true;
      goto LAB_0102df82;
    }
    bVar2 = GetOp((CScript *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                  (const_iterator *)pc_00,(opcodetype *)x.ptr);
    if (!bVar2) break;
    if (0x60 < in_stack_ffffffffffffffec) {
      bVar2 = false;
LAB_0102df82:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return bVar2;
    }
  }
  bVar2 = false;
  goto LAB_0102df82;
}

Assistant:

bool CScript::IsPushOnly(const_iterator pc) const
{
    while (pc < end())
    {
        opcodetype opcode;
        if (!GetOp(pc, opcode))
            return false;
        // Note that IsPushOnly() *does* consider OP_RESERVED to be a
        // push-type opcode, however execution of OP_RESERVED fails, so
        // it's not relevant to P2SH/BIP62 as the scriptSig would fail prior to
        // the P2SH special validation code being executed.
        if (opcode > OP_16)
            return false;
    }
    return true;
}